

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::debugging_internal::ParseQRequiresClauseExpr(State *state)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  
  iVar4 = state->recursion_depth;
  iVar1 = state->steps;
  state->recursion_depth = iVar4 + 1;
  state->steps = iVar1 + 1;
  if (0x1ffff < iVar1 || 0xff < iVar4) goto LAB_00255164;
  iVar4 = (state->parse_state).prev_name_idx;
  iVar1 = (state->parse_state).mangled_idx;
  iVar2 = (state->parse_state).out_cur_idx;
  uVar5 = *(uint *)&(state->parse_state).field_0xc;
  *(uint *)&(state->parse_state).field_0xc = uVar5 & 0x7fffffff;
  bVar3 = ParseOneCharToken(state,'Q');
  if (bVar3) {
    bVar3 = ParseExpression(state);
    if (!bVar3) goto LAB_00255149;
    uVar5 = uVar5 & 0x80000000 | *(uint *)&(state->parse_state).field_0xc & 0x7fffffff;
  }
  else {
LAB_00255149:
    (state->parse_state).prev_name_idx = iVar4;
    (state->parse_state).mangled_idx = iVar1;
    (state->parse_state).out_cur_idx = iVar2;
  }
  *(uint *)&(state->parse_state).field_0xc = uVar5;
  iVar4 = state->recursion_depth + -1;
LAB_00255164:
  state->recursion_depth = iVar4;
  return SUB41(iVar4,0);
}

Assistant:

static bool ParseQRequiresClauseExpr(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  DisableAppend(state);

  // <requires-clause expr> is just an <expression>: http://shortn/_9E1Ul0rIM8
  if (ParseOneCharToken(state, 'Q') && ParseExpression(state)) {
    RestoreAppend(state, copy.append);
    return true;
  }

  // also restores append
  state->parse_state = copy;
  return false;
}